

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

int Abc_AigCountNext(Abc_Aig_t *pMan)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Abc_Obj_t *pAVar5;
  
  iVar1 = pMan->nBins;
  if ((long)iVar1 < 1) {
    uVar3 = 0;
    iVar2 = 0;
  }
  else {
    lVar4 = 0;
    iVar2 = 0;
    uVar3 = 0;
    do {
      pAVar5 = pMan->pBins[lVar4];
      while (pAVar5 != (Abc_Obj_t *)0x0) {
        pAVar5 = pAVar5->pNext;
        uVar3 = uVar3 + (pAVar5 != (Abc_Obj_t *)0x0);
        iVar2 = iVar2 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar1);
  }
  printf("Counter = %d.  Nodes = %d.  Ave = %6.2f\n",(double)iVar2 / (double)iVar1,(ulong)uVar3);
  return uVar3;
}

Assistant:

int Abc_AigCountNext( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pAnd;
    int i, Counter = 0, CounterTotal = 0;
    // count how many nodes have pNext set
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
        {
            Counter += (pAnd->pNext != NULL);
            CounterTotal++;
        }
    printf( "Counter = %d.  Nodes = %d.  Ave = %6.2f\n", Counter, CounterTotal, 1.0 * CounterTotal/pMan->nBins );
    return Counter;
}